

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_overflow.cpp
# Opt level: O2

int main(void)

{
  initializer_list<int> __l;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> v;
  int local_18 [4];
  
  local_18[0] = 0xc;
  local_18[1] = 0x17;
  local_18[2] = 0x22;
  local_18[3] = 0x2d;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,&local_31);
  std::vector<int,_std::allocator<int>_>::reserve(&v,8);
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[6] = 0;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main() {
  std::vector<int> v = { 12, 23, 34, 45 };
  v.reserve(8);
  v.data()[6] = 0;
}